

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.h
# Opt level: O1

void __thiscall mjs::binary_expression::print(binary_expression *this,wostream *os)

{
  expression *peVar1;
  wostream *pwVar2;
  
  pwVar2 = std::operator<<(os,"binary_expression{");
  pwVar2 = mjs::operator<<(pwVar2,this->op_);
  pwVar2 = std::operator<<(pwVar2,", ");
  peVar1 = (this->lhs_)._M_t.
           super___uniq_ptr_impl<mjs::expression,_std::default_delete<mjs::expression>_>._M_t.
           super__Tuple_impl<0UL,_mjs::expression_*,_std::default_delete<mjs::expression>_>.
           super__Head_base<0UL,_mjs::expression_*,_false>._M_head_impl;
  (**(code **)((long)(peVar1->super_syntax_node)._vptr_syntax_node + 0x10))(peVar1,pwVar2);
  pwVar2 = std::operator<<(pwVar2,", ");
  peVar1 = (this->rhs_)._M_t.
           super___uniq_ptr_impl<mjs::expression,_std::default_delete<mjs::expression>_>._M_t.
           super__Tuple_impl<0UL,_mjs::expression_*,_std::default_delete<mjs::expression>_>.
           super__Head_base<0UL,_mjs::expression_*,_false>._M_head_impl;
  (**(code **)((long)(peVar1->super_syntax_node)._vptr_syntax_node + 0x10))(peVar1,pwVar2);
  std::operator<<(pwVar2,"}");
  return;
}

Assistant:

void print(std::wostream& os) const override {
        os << "binary_expression{" << op_ << ", " << *lhs_ << ", " << *rhs_ << "}";
    }